

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O2

void __thiscall Refal2::CRuleParser::afterDirection(CRuleParser *this)

{
  TLabel label;
  size_type i;
  ulong uVar1;
  allocator local_31;
  string local_30;
  
  switch((this->super_CQualifierParser).token.type) {
  case TT_Word:
    wordAfterDirection(this);
    return;
  case TT_Blank:
    goto switchD_001339c1_caseD_2;
  case TT_Comma:
    std::__cxx11::string::string
              ((string *)&local_30,"unexpected token in the function rule",&local_31);
    error(this,&local_30);
    break;
  case TT_Equal:
    CFunctionBuilder::AddEndOfLeft((CFunctionBuilder *)this);
    return;
  case TT_Label:
    label = CModuleBuilder::Declare((CModuleBuilder *)this,&(this->super_CQualifierParser).token);
    CFunctionBuilder::AddLabel((CFunctionBuilder *)this,label);
    return;
  case TT_Number:
    CFunctionBuilder::AddNumber
              ((CFunctionBuilder *)this,(this->super_CQualifierParser).token.number);
    return;
  case TT_String:
    for (uVar1 = 0; uVar1 < (this->super_CQualifierParser).token.word._M_string_length;
        uVar1 = uVar1 + 1) {
      CFunctionBuilder::AddChar
                ((CFunctionBuilder *)this,
                 (this->super_CQualifierParser).token.word._M_dataplus._M_p[uVar1]);
    }
    return;
  case TT_LineFeed:
    CFunctionBuilder::AddEndOfRight((CFunctionBuilder *)this);
    CParsingElementState::SetCorrect(&(this->super_CQualifierParser).super_CParsingElementState);
    return;
  case TT_Qualifier:
    std::__cxx11::string::string
              ((string *)&local_30,"unexpected qualifier in the function rule",&local_31);
    error(this,&local_30);
    break;
  case TT_LeftParen:
    CFunctionBuilder::AddLeftParen((CFunctionBuilder *)this);
    return;
  case TT_RightParen:
    CFunctionBuilder::AddRightParen((CFunctionBuilder *)this);
    return;
  case TT_LeftBracket:
    this->state = (TState)afterLeftBracket;
    *(undefined8 *)&this->field_0x1e80 = 0;
    CFunctionBuilder::AddLeftBracket((CFunctionBuilder *)this);
    return;
  case TT_RightBracket:
    CFunctionBuilder::AddRightBracket((CFunctionBuilder *)this);
    return;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/RuleParser.cpp"
                  ,0x90,"void Refal2::CRuleParser::afterDirection()");
  }
  std::__cxx11::string::~string((string *)&local_30);
switchD_001339c1_caseD_2:
  return;
}

Assistant:

void CRuleParser::afterDirection()
{
	switch( token.type ) {
		case TT_Blank:
			break;
		case TT_Equal:
			CFunctionBuilder::AddEndOfLeft();
			break;
		case TT_Comma:
			error( "unexpected token in the function rule" );
			break;
		case TT_Label:
			CFunctionBuilder::AddLabel( CModuleBuilder::Declare( token ) );
			break;
		case TT_Number:
			CFunctionBuilder::AddNumber( token.number );
			break;
		case TT_String:
			for( std::string::size_type i = 0; i < token.word.length(); i++ ) {
				CFunctionBuilder::AddChar( token.word[i] );
			}
			break;
		case TT_Qualifier:
			error( "unexpected qualifier in the function rule" );
			break;
		case TT_LeftParen:
			CFunctionBuilder::AddLeftParen();
			break;
		case TT_RightParen:
			CFunctionBuilder::AddRightParen();
			break;
		case TT_LeftBracket:
			state = &CRuleParser::afterLeftBracket;
			CFunctionBuilder::AddLeftBracket();
			break;
		case TT_RightBracket:
			CFunctionBuilder::AddRightBracket();
			break;
		case TT_Word:
			wordAfterDirection();
			break;
		case TT_LineFeed:
			CFunctionBuilder::AddEndOfRight();
			SetCorrect();
			break;
		default:
			assert( false );
			break;
	}
}